

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::setKeyNumber(MidiMessage *this,int value)

{
  bool bVar1;
  byte *pbVar2;
  long lVar3;
  
  bVar1 = isNote(this);
  pbVar2 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pbVar2;
  if (bVar1) {
    if ((int)lVar3 < 2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2);
      pbVar2 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  else {
    if (lVar3 != 3) {
      return;
    }
    if ((*pbVar2 & 0xf0) != 0xa0) {
      return;
    }
  }
  pbVar2[1] = (byte)value & 0x7f;
  return;
}

Assistant:

void MidiMessage::setKeyNumber(int value) {
	if (isNote() || isAftertouch()) {
		setP1(value & 0x7f);
	} else {
		// don't do anything since this is not a note-related message.
	}
}